

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatHelpers.cpp
# Opt level: O2

bool slang::ast::FmtHelpers::checkSFormatArgs(ASTContext *context,Args *args)

{
  Expression *this;
  bool bVar1;
  StringLiteral *arg;
  pointer local_20;
  
  local_20 = args->data_ + 1;
  this = *args->data_;
  bVar1 = true;
  if (this->kind == StringLiteral) {
    arg = Expression::as<slang::ast::StringLiteral>(this);
    bVar1 = checkFormatString(context,arg,&local_20,args->data_ + args->size_);
    if (bVar1) {
      if (local_20 == args->data_ + args->size_) {
        return true;
      }
      ASTContext::addDiag(context,(DiagCode)0x15000b,(*local_20)->sourceRange);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FmtHelpers::checkSFormatArgs(const ASTContext& context, const Args& args) {
    // If the format string is known at compile time, check it for correctness now.
    // Otherwise this will wait until runtime.
    auto argIt = args.begin();
    auto arg = *argIt++;
    if (arg->kind != ExpressionKind::StringLiteral)
        return true;

    if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
        return false;

    // Leftover arguments are invalid (all must be consumed by the format string).
    if (argIt != args.end()) {
        context.addDiag(diag::FormatTooManyArgs, (*argIt)->sourceRange);
        return false;
    }

    return true;
}